

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

void __thiscall Table::reindex(Table *this)

{
  ssize_t sVar1;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_00;
  size_t in_RCX;
  long lVar2;
  int __fd;
  pointer pbVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  row;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  mmap;
  Record r;
  fstream file_stream;
  void *local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_418;
  char *local_3d8 [2];
  char local_3c8 [392];
  string local_240 [528];
  
  std::fstream::fstream(local_240);
  get_filename_abi_cxx11_((string *)local_3d8,this);
  std::fstream::open(local_240,(_Ios_Openmode)(Record *)local_3d8);
  if (local_3d8[0] != (char *)((long)((Record *)local_3d8)->buffer + 0xcU)) {
    operator_delete(local_3d8[0]);
  }
  Record::Record((Record *)local_3d8);
  local_438 = (void *)0x1;
  while( true ) {
    __fd = (int)&local_438 + 0x1f8;
    sVar1 = Record::read((Record *)local_3d8,__fd,local_438,in_RCX);
    if (sVar1 < 1) break;
    Record::read((Record *)local_3d8,__fd,local_438,in_RCX);
    Record::to_vector_abi_cxx11_(&local_430,(Record *)local_3d8);
    BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::BPlusTree(&local_418,true);
    pbVar3 = (this->columns).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->columns).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
      lVar2 = 0;
      uVar4 = 0;
      do {
        this_00 = Index::operator[](&this->index,
                                    (string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar2));
        MultiMap::
        MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
        ::insert(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_430.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar2),(long *)&local_438);
        uVar4 = uVar4 + 1;
        pbVar3 = (this->columns).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = lVar2 + 0x20;
      } while (uVar4 < (ulong)((long)(this->columns).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)
              );
    }
    BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::~BPlusTree(&local_418);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_430);
    local_438 = (void *)((long)local_438 + 1);
  }
  std::fstream::close();
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void Table::reindex() {
    std::fstream file_stream;
    file_stream.open(get_filename());
    Record r;
    for (long i = 1; r.read(file_stream, i) > 0; ++i) {
        r.read(file_stream, i);
        auto row = r.to_vector();
        MultiMap::MultiMap<std::string, long> mmap;
        for (size_t j = 0; j < columns.size(); ++j) {
            index[columns[j]].insert(row[j], i);
        }
    }
    file_stream.close();
}